

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# actor.h
# Opt level: O0

DVector2 __thiscall AActor::Vec2Angle(AActor *this,double length,DAngle *angle,bool absolute)

{
  TAngle<double> *this_00;
  byte in_CL;
  undefined7 in_register_00000011;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double extraout_XMM0_Qa;
  DVector2 DVar5;
  bool absolute_local;
  DAngle *angle_local;
  double length_local;
  AActor *this_local;
  
  this_00 = (TAngle<double> *)CONCAT71(in_register_00000011,absolute);
  if ((in_CL & 1) == 0) {
    dVar1 = X((AActor *)angle);
    dVar2 = Y((AActor *)angle);
    dVar3 = TAngle<double>::Cos(this_00);
    dVar4 = TAngle<double>::Sin(this_00);
    DVar5 = P_GetOffsetPosition(dVar1,dVar2,length * dVar3,length * dVar4);
  }
  else {
    dVar1 = X((AActor *)angle);
    dVar2 = TAngle<double>::Cos(this_00);
    dVar3 = Y((AActor *)angle);
    dVar4 = TAngle<double>::Sin(this_00);
    dVar3 = dVar3 + length * dVar4;
    TVector2<double>::TVector2((TVector2<double> *)this,dVar1 + length * dVar2,dVar3);
    DVar5.Y = dVar3;
    DVar5.X = extraout_XMM0_Qa;
  }
  return DVar5;
}

Assistant:

DVector2 Vec2Angle(double length, DAngle angle, bool absolute = false)
	{
		if (absolute)
		{
			return{ X() + length * angle.Cos(), Y() + length * angle.Sin() };
		}
		else
		{
			return P_GetOffsetPosition(X(), Y(), length*angle.Cos(), length*angle.Sin());
		}
	}